

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

ByteData160 * cfd::core::HashUtil::Ripemd160(ByteData160 *__return_storage_ptr__,string *str)

{
  string *message;
  size_t bytes_len;
  CfdException *this;
  size_type len;
  undefined8 uVar1;
  allocator_type *in_stack_ffffffffffffff40;
  size_type in_stack_ffffffffffffff48;
  CfdError error_code;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff50;
  allocator local_81;
  string local_80 [32];
  CfdSourceLocation local_60;
  int local_48 [2];
  int ret;
  undefined1 local_30 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  string *str_local;
  ByteData160 *byte160;
  
  output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)str;
  ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x3ea6e4);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x3ea704);
  message = (string *)::std::__cxx11::string::data();
  bytes_len = ::std::__cxx11::string::size();
  this = (CfdException *)
         ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x3ea734);
  len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  local_48[0] = wally_ripemd160((uchar *)message,bytes_len,(uchar *)this,len);
  error_code = (CfdError)(bytes_len >> 0x20);
  if (local_48[0] == 0) {
    ByteData160::ByteData160
              (__return_storage_ptr__,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
    return __return_storage_ptr__;
  }
  local_60.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_util.cpp"
               ,0x2f);
  local_60.filename = local_60.filename + 1;
  local_60.line = 0xa8;
  local_60.funcname = "Ripemd160";
  logger::warn<int&>(&local_60,"wally_hash160 NG[{}].",local_48);
  uVar1 = __cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_80,"hash160 calc error.",&local_81);
  CfdException::CfdException(this,error_code,message);
  __cxa_throw(uVar1,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ByteData160 HashUtil::Ripemd160(const std::string &str) {
  std::vector<uint8_t> output(RIPEMD160_LEN);
  int ret = wally_ripemd160(
      reinterpret_cast<const uint8_t *>(str.data()), str.size(), output.data(),
      output.size());
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_hash160 NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "hash160 calc error.");
  }

  ByteData160 byte160(output);
  return byte160;
}